

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgga_x_mspbel.c
# Opt level: O0

void func_vxc_unpol(xc_func_type *p,size_t ip,double *rho,double *sigma,double *lapl,double *tau,
                   xc_mgga_out_params *out)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double *pdVar5;
  double *in_RCX;
  long lVar6;
  double *in_RDX;
  long in_RSI;
  long *in_RDI;
  double *in_R9;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double __x;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double __x_00;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double __x_01;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double __x_02;
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  double dVar96;
  double dVar97;
  double dVar98;
  double dVar99;
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  double dVar107;
  double dVar108;
  double dVar109;
  double dVar110;
  double dVar111;
  double dVar112;
  long *in_stack_00000008;
  hyb_mgga_xc_gas22_params *params;
  double tvtau0;
  double t798;
  double t797;
  double t794;
  double t791;
  double t782;
  double t779;
  double t776;
  double t775;
  double t772;
  double t771;
  double t770;
  double t768;
  double t767;
  double t765;
  double t763;
  double t760;
  double t757;
  double t756;
  double t754;
  double t752;
  double t748;
  double t743;
  double t742;
  double t741;
  double t737;
  double t736;
  double t734;
  double t733;
  double t731;
  double t730;
  double tvlapl0;
  double tvsigma0;
  double t728;
  double t727;
  double t723;
  double t722;
  double t721;
  double t719;
  double t715;
  double t708;
  double t704;
  double t703;
  double t696;
  double t695;
  double t694;
  double t690;
  double t689;
  double t685;
  double t684;
  double t682;
  double t678;
  double tvrho0;
  double t675;
  double t674;
  double t671;
  double t668;
  double t667;
  double t663;
  double t660;
  double t659;
  double t658;
  double t657;
  double t656;
  double t652;
  double t648;
  double t644;
  double t640;
  double t639;
  double t638;
  double t635;
  double t634;
  double t633;
  double t632;
  double t628;
  double t627;
  double t625;
  double t623;
  double t622;
  double t621;
  double t620;
  double t616;
  double t615;
  double t613;
  double t608;
  double t607;
  double t606;
  double t601;
  double t598;
  double t597;
  double t596;
  double t594;
  double t591;
  double t590;
  double t589;
  double t587;
  double t585;
  double t584;
  double t583;
  double t582;
  double t580;
  double t579;
  double t578;
  double t573;
  double t572;
  double t568;
  double t560;
  double t559;
  double t558;
  double t554;
  double t552;
  double t550;
  double t549;
  double t548;
  double t547;
  double t543;
  double t541;
  double t539;
  double t538;
  double t536;
  double t535;
  double t534;
  double t533;
  double t530;
  double t529;
  double t528;
  double t525;
  double t524;
  double t523;
  double t520;
  double t519;
  double t516;
  double t513;
  double t509;
  double t508;
  double t503;
  double t502;
  double t496;
  double t494;
  double t490;
  double t489;
  double t484;
  double t483;
  double t482;
  double t477;
  double t476;
  double t475;
  double t471;
  double t468;
  double t467;
  double t466;
  double t461;
  double t460;
  double t459;
  double t455;
  double t454;
  double t452;
  double t451;
  double t450;
  double t448;
  double t446;
  double t444;
  double t443;
  double t441;
  double t439;
  double t438;
  double t436;
  double t435;
  double t434;
  double t433;
  double t432;
  double t429;
  double t428;
  double t427;
  double t426;
  double t423;
  double t422;
  double t420;
  double t415;
  double t414;
  double t411;
  double t410;
  double t407;
  double t406;
  double t402;
  double t401;
  double t400;
  double t399;
  double t397;
  double t396;
  double t392;
  double t391;
  double t386;
  double t385;
  double t381;
  double t378;
  double t373;
  double t369;
  double t368;
  double t364;
  double t362;
  double t358;
  double t354;
  double t350;
  double t346;
  double t342;
  double t338;
  double t337;
  double t334;
  double t333;
  double t330;
  double t329;
  double t325;
  double t323;
  double t322;
  double t318;
  double tzk0;
  double t317;
  double t316;
  double t314;
  double t313;
  double t312;
  double t310;
  double t309;
  double t308;
  double t307;
  double t305;
  double t303;
  double t302;
  double t301;
  double t300;
  double t299;
  double t297;
  double t296;
  double t295;
  double t294;
  double t293;
  double t292;
  double t291;
  double t289;
  double t287;
  double t286;
  double t285;
  double t284;
  double t282;
  double t280;
  double t275;
  double t274;
  double t271;
  double t266;
  double t264;
  double t261;
  double t258;
  double t257;
  double t254;
  double t252;
  double t249;
  double t246;
  double t245;
  double t243;
  double t241;
  double t239;
  double t234;
  double t233;
  double t232;
  double t231;
  double t230;
  double t229;
  double t226;
  double t225;
  double t223;
  double t222;
  double t221;
  double t220;
  double t219;
  double t218;
  double t217;
  double t216;
  double t215;
  double t214;
  double t213;
  double t211;
  double t210;
  double t209;
  double t208;
  double t207;
  double t205;
  double t204;
  double t200;
  double t199;
  double t197;
  double t196;
  double t195;
  double t186;
  double t185;
  double t184;
  double t181;
  double t176;
  double t172;
  double t171;
  double t168;
  double t163;
  double t161;
  double t160;
  double t156;
  double t154;
  double t152;
  double t151;
  double t148;
  double t146;
  double t144;
  double t142;
  double t141;
  double t140;
  double t139;
  double t137;
  double t134;
  double t133;
  double t131;
  double t129;
  double t126;
  double t125;
  double t124;
  double t123;
  double t119;
  double t118;
  double t116;
  double t115;
  double t114;
  double t113;
  double t112;
  double t111;
  double t109;
  double t108;
  double t107;
  double t106;
  double t105;
  double t104;
  double t103;
  double t102;
  double t101;
  double t97;
  double t96;
  double t94;
  double t93;
  double t92;
  double t91;
  double t89;
  double t88;
  double t87;
  double t86;
  double t85;
  double t83;
  double t79;
  double t76;
  double t73;
  double t72;
  double t70;
  double t69;
  double t67;
  double t65;
  double t64;
  double t63;
  double t60;
  double t59;
  double t57;
  double t54;
  double t51;
  double t48;
  double t47;
  double t45;
  double t44;
  double t42;
  double t41;
  double t38;
  double t37;
  double t36;
  double t35;
  double t34;
  double t31;
  double t29;
  double t27;
  double t26;
  double t24;
  double t23;
  double t22;
  double t21;
  double t20;
  double t19;
  double t17;
  double t16;
  double t15;
  double t14;
  double t12;
  double t11;
  double t10;
  double t9;
  double t8;
  double t7;
  double t6;
  double t5;
  double t4;
  double local_d70;
  double local_d68;
  double local_d60;
  double local_d58;
  double local_d50;
  double local_d48;
  double local_d40;
  double local_d38;
  double local_d28;
  double local_d20;
  double local_d10;
  double local_d08;
  double local_d00;
  double local_cf8;
  double local_cf0;
  double local_ce8;
  double local_ce0;
  double local_cd8;
  bool local_cc9;
  
  pdVar5 = (double *)in_RDI[0x2f];
  dVar7 = (double)(1.0 <= (double)in_RDI[0x31]);
  local_cc9 = *in_RDX / 2.0 <= (double)in_RDI[0x30] || dVar7 != 0.0;
  dVar8 = (double)local_cc9;
  dVar9 = cbrt(0.3183098861837907);
  dVar10 = dVar9 * 1.4422495703074083;
  dVar11 = dVar10 * 2.519842099789747 * 1.2599210498948732;
  dVar12 = (double)(2.0 <= (double)in_RDI[0x31]);
  local_d10 = cbrt((double)in_RDI[0x31]);
  local_d38 = local_d10 * (double)in_RDI[0x31];
  local_cd8 = local_d38;
  if ((dVar12 == 0.0) && (!NAN(dVar12))) {
    local_cd8 = 2.5198420997897464;
  }
  dVar13 = cbrt(*in_RDX);
  dVar14 = local_cd8 * dVar13;
  dVar15 = cbrt(9.0);
  dVar15 = dVar15 * dVar15 * dVar9 * dVar9 * (double)in_RDI[4];
  dVar16 = 1.0 / dVar13;
  local_ce0 = local_d10;
  if ((dVar12 == 0.0) && (!NAN(dVar12))) {
    local_ce0 = 1.2599210498948732;
  }
  local_cf0 = (dVar15 * 1.4422495703074083 * dVar16 * (1.2599210498948732 / local_ce0)) / 18.0;
  dVar12 = (double)(1.35 <= local_cf0);
  dVar17 = (double)(1.35 < local_cf0);
  local_ce8 = local_cf0;
  if ((dVar17 == 0.0) && (!NAN(dVar17))) {
    local_ce8 = 1.35;
  }
  dVar18 = local_ce8 * local_ce8;
  dVar19 = dVar18 * dVar18;
  dVar20 = dVar19 * dVar19;
  if ((dVar17 != 0.0) || (NAN(dVar17))) {
    local_cf0 = 1.35;
  }
  dVar21 = sqrt(3.141592653589793);
  dVar22 = erf((1.0 / local_cf0) / 2.0);
  dVar23 = local_cf0 * local_cf0;
  dVar24 = exp(-(1.0 / dVar23) / 4.0);
  dVar25 = -(dVar23 * 2.0) * (dVar24 - 1.0) + (dVar24 - 1.5);
  dVar21 = local_cf0 * 2.0 * dVar25 + dVar21 * dVar22;
  if ((dVar12 != 0.0) || (NAN(dVar12))) {
    local_cf8 = (((((((1.0 / dVar18) / 36.0 - (1.0 / dVar19) / 960.0) +
                    (1.0 / (dVar19 * dVar18)) / 26880.0) - (1.0 / dVar20) / 829440.0) +
                  ((1.0 / dVar20) / dVar18) / 28385280.0) - ((1.0 / dVar20) / dVar19) / 1073479680.0
                 ) + ((1.0 / dVar20) / (dVar19 * dVar18)) / 44590694400.0) -
                (1.0 / (dVar20 * dVar20)) / 2021444812800.0;
  }
  else {
    local_cf8 = -(local_cf0 * 2.6666666666666665) * dVar21 + 1.0;
  }
  dVar22 = pdVar5[1];
  dVar26 = dVar22 * *in_RCX;
  dVar27 = *in_RDX * *in_RDX;
  dVar28 = dVar13 * dVar13;
  dVar29 = (1.0 / dVar28) / dVar27;
  dVar30 = dVar29 * 1.5874010519681996;
  dVar31 = *in_RCX * 1.5874010519681996 * dVar29;
  dVar32 = dVar31 * 0.003840616724010807 + 1.0;
  dVar33 = 1.0 / dVar32;
  dVar1 = pdVar5[2];
  dVar34 = cbrt(9.869604401089358);
  dVar34 = dVar34 * dVar34 * 3.3019272488946267;
  dVar35 = *in_R9 * 1.5874010519681996;
  dVar36 = (1.0 / dVar28) / *in_RDX;
  dVar37 = dVar35 * dVar36;
  dVar38 = dVar34 * 0.3 - dVar37;
  dVar39 = dVar1 * dVar38;
  dVar40 = dVar34 * 0.3 + dVar37;
  dVar41 = 1.0 / dVar40;
  dVar42 = dVar39 * dVar41 + dVar26 * 0.003840616724010807 * dVar30 * dVar33 + *pdVar5;
  dVar43 = local_cf8 * dVar42;
  if ((dVar8 != 0.0) || (NAN(dVar8))) {
    local_d00 = 0.0;
  }
  else {
    local_d00 = dVar11 * -0.046875 * dVar14 * dVar43;
  }
  if ((dVar7 != 0.0) || (NAN(dVar7))) {
    local_d08 = (double)in_RDI[0x31];
  }
  else {
    local_d08 = 1.0;
  }
  dVar44 = dVar10 * 2.519842099789747;
  if ((dVar7 != 0.0) || (NAN(dVar7))) {
    local_d10 = 1.0 / local_d10;
  }
  else {
    local_d10 = 1.0;
  }
  dVar45 = dVar44 * dVar16 * 1.2599210498948732 * local_d10;
  dVar46 = dVar45 * 0.053425 + 1.0;
  dVar47 = sqrt(dVar45);
  dVar48 = sqrt(dVar45);
  dVar48 = dVar45 * dVar48;
  dVar49 = dVar9 * dVar9 * 2.080083823051904;
  dVar50 = 1.0 / dVar28;
  dVar51 = dVar49 * 1.5874010519681996 * dVar50 * 1.5874010519681996 * local_d10 * local_d10;
  dVar52 = dVar51 * 0.123235 + dVar48 * 0.204775 + dVar47 * 3.79785 + dVar45 * 0.8969;
  __x = 16.081979498692537 / dVar52 + 1.0;
  dVar53 = log(__x);
  dVar54 = dVar46 * 0.0621814 * dVar53;
  local_d20 = local_d38;
  if ((double)in_RDI[0x31] < 0.0) {
    local_d20 = 0.0;
  }
  dVar55 = ((local_cd8 + local_d20) - 2.0) * 1.9236610509315362;
  dVar56 = dVar45 * 0.05137 + 1.0;
  dVar57 = dVar51 * 0.1562925 + dVar48 * 0.420775 + dVar47 * 7.05945 + dVar45 * 1.549425;
  __x_00 = 32.16395899738507 / dVar57 + 1.0;
  dVar58 = log(__x_00);
  dVar59 = dVar45 * 0.0278125 + 1.0;
  dVar48 = dVar51 * 0.1241775 + dVar48 * 0.1100325 + dVar47 * 5.1785 + dVar45 * 0.905775;
  dVar60 = 29.608749977793437 / dVar48 + 1.0;
  dVar51 = log(dVar60);
  if ((dVar8 != 0.0) || (NAN(dVar8))) {
    local_d28 = 0.0;
  }
  else {
    local_d28 = (local_d08 *
                (dVar55 * 0.0197516734986138 * dVar59 * dVar51 +
                dVar55 * (dVar59 * dVar51 * -0.0197516734986138 +
                         dVar56 * -0.0310907 * dVar58 + dVar54) + -dVar54)) / 2.0;
  }
  dVar54 = pdVar5[3];
  dVar61 = dVar54 * *in_RCX;
  dVar62 = dVar31 * 0.46914023462026644 + 1.0;
  dVar63 = 1.0 / dVar62;
  dVar2 = pdVar5[4];
  dVar64 = dVar2 * dVar38;
  dVar112 = pdVar5[5];
  dVar65 = dVar38 * dVar38;
  dVar66 = dVar112 * dVar65;
  dVar67 = dVar40 * dVar40;
  dVar68 = 1.0 / dVar67;
  dVar3 = pdVar5[6];
  dVar69 = *in_RCX * *in_RCX;
  dVar70 = dVar69 * dVar69;
  dVar71 = dVar70 * dVar69;
  dVar72 = dVar3 * dVar71;
  dVar73 = dVar27 * dVar27;
  dVar74 = dVar73 * dVar73 * dVar73 * dVar73;
  dVar75 = 1.0 / dVar74;
  dVar76 = dVar62 * dVar62;
  dVar77 = (1.0 / (dVar76 * dVar76)) / dVar76;
  dVar4 = pdVar5[7];
  dVar78 = dVar4 * dVar65 * dVar65;
  dVar79 = 1.0 / (dVar67 * dVar67);
  dVar80 = dVar78 * dVar79;
  dVar81 = dVar80 * 0.17058312527037534 * dVar71 * dVar75 * dVar77 +
           dVar72 * 0.17058312527037534 * dVar75 * dVar77 +
           dVar66 * dVar68 + dVar61 * 0.46914023462026644 * dVar30 * dVar63 + dVar64 * dVar41;
  dVar82 = local_d28 * 2.0 * dVar81;
  dVar16 = dVar10 * 2.519842099789747 * dVar16;
  dVar83 = dVar16 * 0.053425 + 1.0;
  dVar84 = sqrt(dVar16);
  dVar85 = sqrt(dVar16);
  dVar86 = dVar49 * 1.5874010519681996 * dVar50;
  dVar87 = dVar86 * 0.123235 + dVar16 * dVar85 * 0.204775 + dVar84 * 3.79785 + dVar16 * 0.8969;
  __x_01 = 16.081979498692537 / dVar87 + 1.0;
  dVar88 = log(__x_01);
  if ((dVar7 == 0.0) && (!NAN(dVar7))) {
    local_d38 = 1.0;
  }
  dVar89 = (local_d38 + local_d38 + -2.0) * 1.9236610509315362;
  dVar90 = dVar16 * 0.0278125 + 1.0;
  dVar91 = dVar86 * 0.1241775 + dVar16 * dVar85 * 0.1100325 + dVar84 * 5.1785 + dVar16 * 0.905775;
  __x_02 = 29.608749977793437 / dVar91 + 1.0;
  dVar92 = log(__x_02);
  dVar93 = (dVar83 * -0.0621814 * dVar88 + dVar89 * 0.0197516734986138 * dVar90 * dVar92) -
           (local_d28 + local_d28);
  dVar7 = pdVar5[9];
  dVar37 = dVar34 * 0.6 * dVar37;
  dVar94 = *in_R9 * *in_R9 * 1.2599210498948732;
  dVar95 = dVar27 * *in_RDX;
  dVar96 = (1.0 / dVar13) / dVar95;
  dVar85 = dVar94 * 4.0 * dVar96;
  dVar97 = dVar37 - dVar85;
  dVar98 = dVar97 * dVar97;
  dVar99 = dVar7 * dVar98;
  dVar37 = dVar37 + dVar85;
  dVar100 = dVar37 * dVar37;
  dVar101 = 1.0 / dVar100;
  dVar85 = pdVar5[10];
  dVar102 = dVar98 * dVar98 * dVar98;
  dVar103 = dVar85 * dVar102;
  dVar104 = (1.0 / (dVar100 * dVar100)) / dVar100;
  dVar86 = pdVar5[0xb];
  dVar102 = dVar86 * dVar102;
  dVar105 = cbrt(dVar31);
  dVar106 = dVar104 * dVar105;
  dVar31 = pdVar5[0xc];
  dVar107 = dVar31 * dVar98;
  dVar108 = dVar101 * dVar105;
  dVar109 = dVar107 * dVar108 + dVar102 * dVar106 + dVar99 * dVar101 + dVar103 * dVar104 + pdVar5[8]
  ;
  dVar110 = dVar93 * dVar109;
  if ((*in_stack_00000008 != 0) && ((*(uint *)(*in_RDI + 0x40) & 1) != 0)) {
    lVar6 = in_RSI * (int)in_RDI[0xb];
    *(double *)(*in_stack_00000008 + lVar6 * 8) =
         local_d00 * 2.0 + dVar82 + dVar110 + *(double *)(*in_stack_00000008 + lVar6 * 8);
  }
  dVar18 = dVar18 * local_ce8;
  dVar111 = (1.0 / dVar13) / *in_RDX;
  local_d48 = (dVar15 * 1.4422495703074083 * dVar111 * (1.2599210498948732 / local_ce0)) / 54.0;
  if ((dVar17 != 0.0) || (NAN(dVar17))) {
    local_d40 = -local_d48;
  }
  else {
    local_d40 = 0.0;
  }
  if ((dVar17 != 0.0) || (NAN(dVar17))) {
    local_d48 = 0.0;
  }
  else {
    local_d48 = -local_d48;
  }
  if ((dVar12 != 0.0) || (NAN(dVar12))) {
    local_d50 = (((((((-(1.0 / dVar18) * local_d40) / 18.0 +
                     ((1.0 / (dVar19 * local_ce8)) * local_d40) / 240.0) -
                    ((1.0 / (dVar19 * dVar18)) * local_d40) / 4480.0) +
                   (((1.0 / dVar20) / local_ce8) * local_d40) / 103680.0) -
                  (((1.0 / dVar20) / dVar18) * local_d40) / 2838528.0) +
                 (((1.0 / dVar20) / (dVar19 * local_ce8)) * local_d40) / 89456640.0) -
                (((1.0 / dVar20) / (dVar19 * dVar18)) * local_d40) / 3185049600.0) +
                (((1.0 / (dVar20 * dVar20)) / local_ce8) * local_d40) / 126340300800.0;
  }
  else {
    local_d50 = local_d48 * -2.6666666666666665 * dVar21 +
                -(local_cf0 * 2.6666666666666665 *
                 (local_cf0 * 2.0 *
                  (-((1.0 / local_cf0) * local_d48) * dVar24 +
                  -(local_cf0 * (dVar24 - 1.0) * 4.0) * local_d48 +
                  ((1.0 / (dVar23 * local_cf0)) * local_d48 * dVar24) / 2.0) +
                 -(dVar24 * (1.0 / dVar23)) * local_d48 + local_d48 * 2.0 * dVar25));
  }
  dVar19 = ((1.0 / dVar28) / dVar95) * 1.5874010519681996;
  dVar12 = ((1.0 / dVar13) / (dVar73 * dVar27)) * 1.2599210498948732;
  dVar15 = 1.0 / (dVar32 * dVar32);
  dVar17 = dVar35 * dVar29;
  if ((dVar8 != 0.0) || (NAN(dVar8))) {
    local_d58 = 0.0;
  }
  else {
    local_d58 = -(dVar11 * 0.046875 * dVar14) *
                local_cf8 *
                (dVar39 * dVar68 * 1.6666666666666667 * dVar17 +
                dVar1 * *in_R9 * 1.6666666666666667 * dVar30 * dVar41 +
                dVar26 * -0.010241644597362152 * dVar19 * dVar33 +
                dVar22 * dVar69 * 7.866846304400802e-05 * dVar12 * dVar15) +
                -(dVar11 * 0.046875 * dVar14) * local_d50 * dVar42 +
                (-dVar11 * local_cd8 * dVar50 * dVar43) / 64.0;
  }
  dVar20 = dVar111 * 1.2599210498948732;
  dVar18 = dVar44 * 0.0011073470983333333 * dVar20 * local_d10 * dVar53;
  dVar21 = dVar111 * 2.519842099789747;
  dVar32 = dVar21 * local_d10 * 1.2599210498948732;
  dVar23 = (1.0 / dVar47) * 1.4422495703074083 * dVar9 * dVar32;
  dVar24 = dVar44 * dVar20 * local_d10;
  dVar25 = sqrt(dVar45);
  dVar32 = dVar25 * 1.4422495703074083 * dVar9 * dVar32;
  dVar25 = dVar49 * 1.5874010519681996 * dVar36 * 1.5874010519681996 * local_d10 * local_d10;
  dVar42 = dVar46 * (1.0 / (dVar52 * dVar52)) * 1.0 *
           (dVar25 * -0.08215666666666667 +
           dVar32 * -0.1023875 + dVar23 * -0.632975 + -(dVar24 * 0.29896666666666666)) * (1.0 / __x)
  ;
  dVar43 = 1.0 / (dVar48 * dVar48);
  dVar45 = dVar25 * -0.082785 +
           dVar32 * -0.05501625 + dVar23 * -0.8630833333333333 + -(dVar24 * 0.301925);
  dVar60 = 1.0 / dVar60;
  if ((dVar8 != 0.0) || (NAN(dVar8))) {
    local_d60 = 0.0;
  }
  else {
    local_d60 = (local_d08 *
                (-(dVar55 * dVar59 * 0.5848223622634646) * dVar43 * dVar45 * dVar60 +
                -(dVar55 * dVar10 * 0.00018311447306006544 * dVar21) *
                local_d10 * 1.2599210498948732 * dVar51 +
                dVar55 * (dVar59 * dVar43 * 0.5848223622634646 * dVar45 * dVar60 +
                         dVar44 * 0.00018311447306006544 * dVar20 * local_d10 * dVar51 +
                         (((dVar44 * 0.0005323764196666666 * dVar20 * local_d10 * dVar58 +
                           dVar56 * (1.0 / (dVar57 * dVar57)) * 1.0 *
                           (dVar25 * -0.104195 +
                           dVar32 * -0.2103875 + dVar23 * -1.176575 + -(dVar24 * 0.516475)) *
                           (1.0 / __x_00)) - dVar18) - dVar42)) + dVar18 + dVar42)) / 2.0;
  }
  dVar112 = dVar112 * dVar38;
  dVar18 = 1.0 / (dVar67 * dVar40);
  dVar20 = *in_RDX;
  dVar23 = 1.0 / (dVar74 * dVar20);
  dVar24 = dVar70 * dVar69 * *in_RCX;
  dVar25 = (1.0 / dVar28) / (dVar74 * dVar95);
  dVar32 = (1.0 / (dVar76 * dVar76)) / (dVar76 * dVar62);
  dVar38 = dVar4 * dVar65 * dVar38;
  dVar27 = (1.0 / dVar28) / (dVar74 * dVar27);
  dVar35 = dVar27 * dVar77 * dVar35;
  dVar40 = (1.0 / (dVar67 * dVar67)) / dVar40;
  dVar12 = local_d28 *
           (dVar80 * 1.2804385185856348 * dVar24 * dVar25 * dVar32 * 1.5874010519681996 +
           -(dVar80 * 2.7293300043260054 * dVar71 * dVar23) * dVar77 +
           dVar78 * dVar40 * dVar71 * 1.1372208351358355 * dVar35 +
           dVar38 * dVar79 * dVar71 * 1.1372208351358355 * dVar35 +
           dVar3 * dVar24 * 1.2804385185856348 * dVar25 * dVar32 * 1.5874010519681996 +
           -(dVar72 * 2.7293300043260054) * dVar23 * dVar77 +
           dVar66 * dVar18 * 3.3333333333333335 * dVar17 +
           dVar112 * dVar68 * 3.3333333333333335 * dVar17 +
           dVar64 * dVar68 * 1.6666666666666667 * dVar17 +
           dVar2 * *in_R9 * 1.6666666666666667 * dVar30 * dVar41 +
           dVar61 * -1.2510406256540438 * dVar19 * dVar63 +
           dVar54 * dVar69 * 1.1738269852776462 * dVar12 * (1.0 / dVar76));
  dVar24 = dVar9 * 2.519842099789747 * dVar111;
  dVar23 = (1.0 / dVar84) * 1.4422495703074083 * dVar24;
  dVar16 = sqrt(dVar16);
  dVar24 = dVar16 * 1.4422495703074083 * dVar24;
  dVar16 = dVar49 * 1.5874010519681996 * dVar36;
  dVar7 = dVar7 * dVar97;
  dVar42 = dVar94 * 13.333333333333334 * ((1.0 / dVar13) / dVar73);
  dVar25 = -(dVar34 * dVar17) + dVar42;
  dVar30 = 1.0 / (dVar100 * dVar37);
  dVar42 = -(dVar34 * dVar17) - dVar42;
  dVar17 = dVar98 * dVar98 * dVar97;
  dVar85 = dVar85 * dVar17;
  dVar43 = (1.0 / (dVar100 * dVar100)) / (dVar100 * dVar37);
  dVar86 = dVar86 * dVar17;
  dVar17 = 1.0 / (dVar105 * dVar105);
  dVar19 = dVar17 * *in_RCX * dVar19;
  dVar31 = dVar31 * dVar97;
  if ((in_stack_00000008[1] != 0) && ((*(uint *)(*in_RDI + 0x40) & 2) != 0)) {
    lVar6 = in_RSI * *(int *)((long)in_RDI + 0x5c);
    *(double *)(in_stack_00000008[1] + lVar6 * 8) =
         *in_RDX * (dVar12 + dVar12 + local_d58 + local_d58 + local_d60 * dVar81 * 2.0 +
                    ((-(dVar89 * dVar90 * 0.5848223622634646) *
                      (1.0 / (dVar91 * dVar91)) *
                      (dVar16 * -0.082785 +
                      dVar24 * -0.05501625 +
                      dVar23 * -0.8630833333333333 + -(dVar10 * dVar21 * 0.301925)) * (1.0 / __x_02)
                     + -(dVar89 * 1.4422495703074083 * 0.00018311447306006544 *
                         dVar9 * 2.519842099789747 * dVar111) * dVar92 +
                       dVar10 * 0.0011073470983333333 * dVar21 * dVar88 +
                       dVar83 * (1.0 / (dVar87 * dVar87)) * 1.0 *
                       (dVar16 * -0.08215666666666667 +
                       dVar24 * -0.1023875 +
                       dVar23 * -0.632975 + -(dVar10 * dVar21 * 0.29896666666666666)) *
                       (1.0 / __x_01)) - (local_d60 + local_d60)) * dVar109 +
                   dVar93 * (-(dVar107 * dVar101 * 0.8888888888888888) * dVar19 +
                            -(dVar107 * 2.0) * dVar30 * dVar105 * dVar42 +
                            dVar31 * 2.0 * dVar108 * dVar25 +
                            -(dVar102 * dVar104 * 0.8888888888888888) * dVar19 +
                            -(dVar102 * 6.0 * dVar43 * dVar105) * dVar42 +
                            dVar86 * 6.0 * dVar106 * dVar25 +
                            -(dVar103 * 6.0 * dVar43) * dVar42 +
                            dVar85 * 6.0 * dVar104 * dVar25 +
                            dVar7 * 2.0 * dVar101 * dVar25 + -(dVar99 * 2.0 * dVar30 * dVar42))) +
         local_d00 * 2.0 + dVar82 + dVar110 + *(double *)(in_stack_00000008[1] + lVar6 * 8);
  }
  dVar9 = ((1.0 / dVar13) / (dVar73 * *in_RDX)) * 1.2599210498948732;
  if ((dVar8 != 0.0) || (NAN(dVar8))) {
    local_d68 = 0.0;
  }
  else {
    local_d68 = dVar11 * -0.046875 * dVar14 *
                local_cf8 *
                (dVar22 * 1.5874010519681996 * 0.003840616724010807 * dVar29 * dVar33 +
                -(dVar26 * 2.9500673641503008e-05 * dVar9 * dVar15));
  }
  dVar10 = dVar17 * 1.5874010519681996 * dVar29;
  if ((in_stack_00000008[2] != 0) && ((*(uint *)(*in_RDI + 0x40) & 2) != 0)) {
    lVar6 = in_RSI * (int)in_RDI[0xc];
    *(double *)(in_stack_00000008[2] + lVar6 * 8) =
         *in_RDX * (local_d68 * 2.0 +
                    local_d28 * 2.0 *
                    (-(dVar80 * 0.4801644444696131 * dVar71 * dVar27) * dVar32 * 1.5874010519681996
                    + dVar80 * 1.023498751622252 * dVar70 * *in_RCX * dVar75 * dVar77 +
                      -(dVar72 * 0.4801644444696131) * dVar27 * dVar32 * 1.5874010519681996 +
                      dVar3 * dVar70 * *in_RCX * 1.023498751622252 * dVar75 * dVar77 +
                      dVar54 * 1.5874010519681996 * 0.46914023462026644 * dVar29 * dVar63 +
                      -(dVar61 * 0.44018511947911726 * dVar9 * (1.0 / dVar76))) +
                   dVar93 * ((dVar102 * dVar104 * dVar10) / 3.0 + (dVar107 * dVar101 * dVar10) / 3.0
                            )) + *(double *)(in_stack_00000008[2] + lVar6 * 8);
  }
  if (((in_stack_00000008[3] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x8000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 2) != 0)) {
    lVar6 = in_RSI * *(int *)((long)in_RDI + 100);
    *(double *)(in_stack_00000008[3] + lVar6 * 8) =
         *(double *)(in_stack_00000008[3] + lVar6 * 8) + 0.0;
  }
  dVar9 = dVar68 * 1.5874010519681996 * dVar36;
  if ((dVar8 != 0.0) || (NAN(dVar8))) {
    local_d70 = 0.0;
  }
  else {
    local_d70 = dVar11 * -0.046875 * dVar14 *
                local_cf8 * (-dVar39 * dVar9 + -(dVar1 * 1.5874010519681996 * dVar36 * dVar41));
  }
  dVar8 = dVar71 * ((1.0 / dVar28) / (dVar74 * dVar20)) * dVar77 * 1.5874010519681996;
  dVar11 = dVar34 * 0.6 * dVar36 * 1.5874010519681996;
  dVar96 = *in_R9 * 1.2599210498948732 * 8.0 * dVar96;
  dVar10 = dVar11 - dVar96;
  dVar11 = dVar11 + dVar96;
  if (((in_stack_00000008[4] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x10000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 2) != 0)) {
    lVar6 = in_RSI * (int)in_RDI[0xd];
    *(double *)(in_stack_00000008[4] + lVar6 * 8) =
         *in_RDX * (local_d70 * 2.0 +
                    local_d28 * 2.0 *
                    (-(dVar78 * dVar40 * 0.6823325010815013) * dVar8 +
                    -(dVar38 * dVar79 * 0.6823325010815013) * dVar8 +
                    -(dVar66 * 2.0 * dVar18 * 1.5874010519681996) * dVar36 +
                    -(dVar112 * 2.0) * dVar9 +
                    -(dVar2 * 1.5874010519681996) * dVar36 * dVar41 + -(dVar64 * dVar9)) +
                   dVar93 * (dVar31 * 2.0 * dVar108 * dVar10 +
                            dVar85 * 6.0 * dVar104 * dVar10 +
                            dVar7 * 2.0 * dVar101 * dVar10 +
                            -(dVar107 * 2.0) * dVar30 * dVar105 * dVar11 +
                            -(dVar103 * 6.0) * dVar43 * dVar11 +
                            -(dVar99 * 2.0) * dVar30 * dVar11 +
                            dVar102 * -6.0 * dVar43 * dVar105 * dVar11 +
                            dVar86 * 6.0 * dVar106 * dVar10)) +
         *(double *)(in_stack_00000008[4] + lVar6 * 8);
  }
  return;
}

Assistant:

GPU_DEVICE_FUNCTION static inline void
func_vxc_unpol(const xc_func_type *p, size_t ip, const double *rho, const double *sigma, const double *lapl, const double *tau, xc_mgga_out_params *out)
{
  double t3, t4, t5, t7, t8, t9, t11, t12;
  double t14, t16, t18, t19, t20, t21, t22, t23;
  double t24, t25, t26, t27, t28, t29, t30, t31;
  double t33, t34, t35, t39, t40, t41, t43, t44;
  double t46, t48, t49, t51, t52, t53, t56, t59;
  double t60, t61, t63, t64, t65, t66, t67, t68;
  double t70, t72, t73, t75, t77, t78, t79, t82;
  double t84, t85, t87, t89, t93, tzk0;

  double t95, t99, t101, t102, t103, t105, t107, t108;
  double t109, t110, t111, t112, t114, t115, t116, t117;
  double t118, t121, t122, t123, t126, t128, t131, t132;
  double t135, t136, t139, t140, t141, t144, t145, t146;
  double t149, t150, t154, t155, t156, t159, t160, t162;
  double t165, t166, t167, t168, t169, t173, t175, t180;
  double tvrho0, t184, t186, t188, t189, t192, t193, t194;
  double t195, t198, t199, t202, t206, t208, t212, t213;
  double t218, t219, t224, t226, t230, tvsigma0, tvlapl0, t232;
  double t233, t234, t242, t243, t245, t249, tvtau0;

  mgga_x_mspbel_params *params;

  assert(p->params != NULL);
  params = (mgga_x_mspbel_params * ) (p->params);

  t3 = rho[0] / 0.2e1 <= p->dens_threshold;
  t4 = M_CBRT3;
  t5 = M_CBRTPI;
  t7 = t4 / t5;
  t8 = 0.1e1 <= p->zeta_threshold;
  t9 = p->zeta_threshold - 0.1e1;
  t11 = my_piecewise5(t8, t9, t8, -t9, 0);
  t12 = 0.1e1 + t11;
  t14 = POW_1_3(p->zeta_threshold);
  t16 = POW_1_3(t12);
  t18 = my_piecewise3(t12 <= p->zeta_threshold, t14 * p->zeta_threshold, t16 * t12);
  t19 = POW_1_3(rho[0]);
  t20 = t18 * t19;
  t21 = M_CBRT6;
  t22 = M_PI * M_PI;
  t23 = POW_1_3(t22);
  t24 = t23 * t23;
  t25 = 0.1e1 / t24;
  t26 = t21 * t25;
  t27 = t26 * sigma[0];
  t28 = M_CBRT2;
  t29 = t28 * t28;
  t30 = rho[0] * rho[0];
  t31 = t19 * t19;
  t33 = 0.1e1 / t31 / t30;
  t34 = t29 * t33;
  t35 = 0.1e1 / params->kappa;
  t39 = 0.1e1 + 0.5e1 / 0.972e3 * t27 * t34 * t35;
  t40 = 0.1e1 / t39;
  t41 = t34 * t40;
  t43 = 0.5e1 / 0.972e3 * t27 * t41;
  t44 = tau[0] * t29;
  t46 = 0.1e1 / t31 / rho[0];
  t48 = sigma[0] * t29;
  t49 = t48 * t33;
  t51 = t44 * t46 - t49 / 0.8e1;
  t52 = t51 * t51;
  t53 = t21 * t21;
  t56 = params->eta * sigma[0];
  t59 = 0.3e1 / 0.1e2 * t53 * t24 + t56 * t34 / 0.8e1;
  t60 = t59 * t59;
  t61 = 0.1e1 / t60;
  t63 = -t52 * t61 + 0.1e1;
  t64 = t63 * t63;
  t65 = t64 * t63;
  t66 = t52 * t51;
  t67 = t60 * t59;
  t68 = 0.1e1 / t67;
  t70 = t52 * t52;
  t72 = params->b * t70 * t52;
  t73 = t60 * t60;
  t75 = 0.1e1 / t73 / t60;
  t77 = t66 * t68 + t72 * t75 + 0.1e1;
  t78 = 0.1e1 / t77;
  t79 = t65 * t78;
  t82 = 0.5e1 / 0.972e3 * t26 * t49 + params->c;
  t84 = t82 * t35 + 0.1e1;
  t85 = 0.1e1 / t84;
  t87 = t82 * t85 - t43;
  t89 = t79 * t87 + t43 + 0.1e1;
  t93 = my_piecewise3(t3, 0, -0.3e1 / 0.8e1 * t7 * t20 * t89);
  tzk0 = 0.2e1 * t93;

  if(out->zk != NULL && (p->info->flags & XC_FLAGS_HAVE_EXC))
    out->zk[ip*p->dim.zk + 0] += tzk0;

  t95 = t18 / t31;
  t99 = t30 * rho[0];
  t101 = 0.1e1 / t31 / t99;
  t102 = t29 * t101;
  t103 = t102 * t40;
  t105 = 0.1e2 / 0.729e3 * t27 * t103;
  t107 = 0.1e1 / t23 / t22;
  t108 = t53 * t107;
  t109 = sigma[0] * sigma[0];
  t110 = t108 * t109;
  t111 = t30 * t30;
  t112 = t111 * t30;
  t114 = 0.1e1 / t19 / t112;
  t115 = t28 * t114;
  t116 = t39 * t39;
  t117 = 0.1e1 / t116;
  t118 = t117 * t35;
  t121 = 0.25e2 / 0.177147e6 * t110 * t115 * t118;
  t122 = t64 * t78;
  t123 = t51 * t61;
  t126 = t48 * t101;
  t128 = -0.5e1 / 0.3e1 * t44 * t33 + t126 / 0.3e1;
  t131 = t52 * t68;
  t132 = t131 * params->eta;
  t135 = -0.2e1 * t123 * t128 - 0.2e1 / 0.3e1 * t132 * t126;
  t136 = t87 * t135;
  t139 = t77 * t77;
  t140 = 0.1e1 / t139;
  t141 = t65 * t140;
  t144 = 0.1e1 / t73;
  t145 = t66 * t144;
  t146 = t145 * params->eta;
  t149 = params->b * t70 * t51;
  t150 = t75 * t128;
  t154 = 0.1e1 / t73 / t67;
  t155 = t72 * t154;
  t156 = t56 * t102;
  t159 = t146 * t126 + 0.3e1 * t131 * t128 + 0.6e1 * t149 * t150 + 0.2e1 * t155 * t156;
  t160 = t87 * t159;
  t162 = t102 * t85;
  t165 = t84 * t84;
  t166 = 0.1e1 / t165;
  t167 = t82 * t166;
  t168 = t167 * t26;
  t169 = t101 * t35;
  t173 = -0.1e2 / 0.729e3 * t27 * t162 + 0.1e2 / 0.729e3 * t168 * t48 * t169 + t105 - t121;
  t175 = 0.3e1 * t122 * t136 - t141 * t160 + t79 * t173 - t105 + t121;
  t180 = my_piecewise3(t3, 0, -t7 * t95 * t89 / 0.8e1 - 0.3e1 / 0.8e1 * t7 * t20 * t175);
  tvrho0 = 0.2e1 * rho[0] * t180 + 0.2e1 * t93;

  if(out->vrho != NULL && (p->info->flags & XC_FLAGS_HAVE_VXC))
    out->vrho[ip*p->dim.vrho + 0] += tvrho0;

  t184 = 0.5e1 / 0.972e3 * t26 * t41;
  t186 = t111 * rho[0];
  t188 = 0.1e1 / t19 / t186;
  t189 = t28 * t188;
  t192 = 0.25e2 / 0.472392e6 * t108 * sigma[0] * t189 * t118;
  t193 = t123 * t34;
  t194 = params->eta * t29;
  t195 = t194 * t33;
  t198 = t131 * t195 / 0.4e1 + t193 / 0.4e1;
  t199 = t87 * t198;
  t202 = t131 * t34;
  t206 = t75 * t29;
  t208 = t149 * t206 * t33;
  t212 = -0.3e1 / 0.8e1 * t202 - 0.3e1 / 0.8e1 * t145 * t195 - 0.3e1 / 0.4e1 * t208 - 0.3e1 / 0.4e1 * t155 * t195;
  t213 = t87 * t212;
  t218 = t167 * t21;
  t219 = t25 * t29;
  t224 = 0.5e1 / 0.972e3 * t26 * t34 * t85 - 0.5e1 / 0.972e3 * t218 * t219 * t33 * t35 - t184 + t192;
  t226 = 0.3e1 * t122 * t199 - t141 * t213 + t79 * t224 + t184 - t192;
  t230 = my_piecewise3(t3, 0, -0.3e1 / 0.8e1 * t7 * t20 * t226);
  tvsigma0 = 0.2e1 * rho[0] * t230;

  if(out->vsigma != NULL && (p->info->flags & XC_FLAGS_HAVE_VXC))
    out->vsigma[ip*p->dim.vsigma + 0] += tvsigma0;

  tvlapl0 = 0.e0;

  if(out->vlapl != NULL && (p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN) && (p->info->flags & XC_FLAGS_HAVE_VXC))
    out->vlapl[ip*p->dim.vlapl + 0] += tvlapl0;

  t232 = t122 * t87;
  t233 = t29 * t46;
  t234 = t123 * t233;
  t242 = 0.6e1 * t149 * t206 * t46 + 0.3e1 * t131 * t233;
  t243 = t87 * t242;
  t245 = -t141 * t243 - 0.6e1 * t232 * t234;
  t249 = my_piecewise3(t3, 0, -0.3e1 / 0.8e1 * t7 * t20 * t245);
  tvtau0 = 0.2e1 * rho[0] * t249;

  if(out->vtau != NULL && (p->info->flags & XC_FLAGS_NEEDS_TAU) && (p->info->flags & XC_FLAGS_HAVE_VXC))
    out->vtau[ip*p->dim.vtau + 0] += tvtau0;

}